

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void exprSetHeight(Expr *p)

{
  u32 uVar1;
  int local_18;
  int local_14;
  Expr *pEStack_10;
  int nHeight;
  Expr *p_local;
  
  if (p->pLeft == (Expr *)0x0) {
    local_18 = 0;
  }
  else {
    local_18 = p->pLeft->nHeight;
  }
  local_14 = local_18;
  if ((p->pRight != (Expr *)0x0) && (local_18 < p->pRight->nHeight)) {
    local_14 = p->pRight->nHeight;
  }
  pEStack_10 = p;
  if ((p->flags & 0x1000) == 0) {
    if ((p->x).pList != (ExprList *)0x0) {
      heightOfExprList((p->x).pList,&local_14);
      uVar1 = sqlite3ExprListFlags((pEStack_10->x).pList);
      pEStack_10->flags = uVar1 & 0x400208 | pEStack_10->flags;
    }
  }
  else {
    heightOfSelect((p->x).pSelect,&local_14);
  }
  pEStack_10->nHeight = local_14 + 1;
  return;
}

Assistant:

static void exprSetHeight(Expr *p){
  int nHeight = p->pLeft ? p->pLeft->nHeight : 0;
  if( p->pRight && p->pRight->nHeight>nHeight ) nHeight = p->pRight->nHeight;
  if( ExprUseXSelect(p) ){
    heightOfSelect(p->x.pSelect, &nHeight);
  }else if( p->x.pList ){
    heightOfExprList(p->x.pList, &nHeight);
    p->flags |= EP_Propagate & sqlite3ExprListFlags(p->x.pList);
  }
  p->nHeight = nHeight + 1;
}